

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nes_apu.c
# Opt level: O0

void nes_apu_update(void *chip,UINT32 samples,DEV_SMPL **outputs)

{
  char cVar1;
  char cVar2;
  DEV_SMPL *pDVar3;
  DEV_SMPL *pDVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  short local_5c;
  short local_58;
  short local_54;
  INT16 dpcm;
  INT16 noi;
  INT16 tri;
  INT16 squ2;
  INT16 squ1;
  UINT32 i;
  DEV_SMPL *bufR;
  DEV_SMPL *bufL;
  apu_t *apu;
  nesapu_state *info;
  DEV_SMPL **outputs_local;
  UINT32 samples_local;
  void *chip_local;
  
  pDVar3 = *outputs;
  pDVar4 = outputs[1];
  for (_noi = 0; _noi < samples; _noi = _noi + 1) {
    apu_square((nesapu_state *)chip,(square_t *)((long)chip + 8));
    apu_square((nesapu_state *)chip,(square_t *)((long)chip + 0x30));
    apu_triangle((nesapu_state *)chip,(triangle_t *)((long)chip + 0x58));
    apu_noise((nesapu_state *)chip,(noise_t *)((long)chip + 0x80));
    apu_dpcm((nesapu_state *)chip,(dpcm_t *)((long)chip + 0xa0));
    if (*(char *)((long)chip + 0xf9) == '\0') {
      sVar5 = (short)*(char *)((long)chip + 0x23) << 8;
      sVar6 = (short)*(char *)((long)chip + 0x4b) << 8;
      sVar7 = *(char *)((long)chip + 0x73) * 0xc0;
      sVar8 = *(char *)((long)chip + 0x96) * 0xc0;
      sVar9 = *(char *)((long)chip + 0xc2) * 0xc0;
      pDVar3[_noi] = (int)sVar5 * *(int *)((long)chip + 0x28) >> 0x10;
      pDVar4[_noi] = (int)sVar5 * *(int *)((long)chip + 0x2c) >> 0x10;
      pDVar3[_noi] = ((int)sVar6 * *(int *)((long)chip + 0x50) >> 0x10) + pDVar3[_noi];
      pDVar4[_noi] = ((int)sVar6 * *(int *)((long)chip + 0x54) >> 0x10) + pDVar4[_noi];
      pDVar3[_noi] = ((int)sVar7 * *(int *)((long)chip + 0x78) >> 0x10) + pDVar3[_noi];
      pDVar4[_noi] = ((int)sVar7 * *(int *)((long)chip + 0x7c) >> 0x10) + pDVar4[_noi];
      pDVar3[_noi] = ((int)sVar8 * *(int *)((long)chip + 0x98) >> 0x10) + pDVar3[_noi];
      pDVar4[_noi] = ((int)sVar8 * *(int *)((long)chip + 0x9c) >> 0x10) + pDVar4[_noi];
      pDVar3[_noi] = (int)((ulong)((long)sVar9 * (long)*(int *)((long)chip + 0xc4)) >> 0x10) +
                     pDVar3[_noi];
      pDVar4[_noi] = (int)((ulong)((long)sVar9 * (long)*(int *)((long)chip + 200)) >> 0x10) +
                     pDVar4[_noi];
    }
    else {
      if (*(char *)((long)chip + 0x23) < '\0') {
        local_54 = 0;
      }
      else {
        local_54 = (short)*(char *)((long)chip + 0x23);
      }
      if (*(char *)((long)chip + 0x4b) < '\0') {
        local_58 = 0;
      }
      else {
        local_58 = (short)*(char *)((long)chip + 0x4b);
      }
      cVar1 = *(char *)((long)chip + 0x73);
      if (*(char *)((long)chip + 0x96) < '\0') {
        local_5c = 0;
      }
      else {
        local_5c = (short)*(char *)((long)chip + 0x96);
      }
      cVar2 = *(char *)((long)chip + 0xc2);
      pDVar3[_noi] = square_lut[(int)local_54 + (int)local_58];
      pDVar3[_noi] = tnd_lut[(short)((cVar1 + 0x10) / 2)][local_5c][(short)cVar2] + pDVar3[_noi];
      pDVar4[_noi] = pDVar3[_noi];
    }
  }
  return;
}

Assistant:

void nes_apu_update(void* chip, UINT32 samples, DEV_SMPL **outputs)
{
	nesapu_state *info = (nesapu_state*)chip;
	apu_t *apu = &info->APU;
	DEV_SMPL* bufL = outputs[0];
	DEV_SMPL* bufR = outputs[1];
	UINT32 i;

	for (i = 0; i < samples; i++)
	{
		INT16 squ1, squ2, tri, noi, dpcm;

		apu_square(info, &apu->squ[0]);
		apu_square(info, &apu->squ[1]);
		apu_triangle(info, &apu->tri);
		apu_noise(info, &apu->noi);
		apu_dpcm(info, &apu->dpcm);

		if (info->nonlinear_mixing)
		{
			squ1 = (apu->squ[0].output >= 0) ? apu->squ[0].output : 0;
			squ2 = (apu->squ[1].output >= 0) ? apu->squ[1].output : 0;
			tri  = (apu->tri.output + 0x10) / 2;
			noi  = (apu->noi.output >= 0) ? apu->noi.output : 0;
			dpcm = apu->dpcm.output;
			bufL[i] = square_lut[squ1 + squ2];
			bufL[i] += tnd_lut[tri][noi][dpcm];
			bufR[i] = bufL[i];
		}
		else
		{
			// These volumes should match NSFPlay's NES core better
			squ1 = apu->squ[0].output * 0x100;	// [-15..+15] << 8 * 1.0
			squ2 = apu->squ[1].output * 0x100;	// [-15..+15] << 8 * 1.0
			tri  = apu->tri.output * 0xC0;	// [-16..+16] << 8 * 0.75
			noi  = apu->noi.output * 0xC0;	// [-15..+15] << 8 * 0.75
			dpcm = apu->dpcm.output * 0xC0;	// [0..+127] << 8 * 0.75

			bufL[i]  = APPLY_PANNING_S(squ1, apu->squ[0].Pan[0]);
			bufR[i]  = APPLY_PANNING_S(squ1, apu->squ[0].Pan[1]);
			bufL[i] += APPLY_PANNING_S(squ2, apu->squ[1].Pan[0]);
			bufR[i] += APPLY_PANNING_S(squ2, apu->squ[1].Pan[1]);
			bufL[i] += APPLY_PANNING_S(tri, apu->tri.Pan[0]);
			bufR[i] += APPLY_PANNING_S(tri, apu->tri.Pan[1]);
			bufL[i] += APPLY_PANNING_S(noi, apu->noi.Pan[0]);
			bufR[i] += APPLY_PANNING_S(noi, apu->noi.Pan[1]);
			bufL[i] += APPLY_PANNING_L(dpcm, apu->dpcm.Pan[0]);	// could be 0..24384, thus use _L macro
			bufR[i] += APPLY_PANNING_L(dpcm, apu->dpcm.Pan[1]);
		}
	}
}